

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_count_death(wchar_t i)

{
  _Bool _Var1;
  ulong uVar2;
  borg_kill *pbVar3;
  
  uVar2 = (ulong)borg_kills[i].r_idx;
  if (uVar2 != 0) {
    if (borg_race_death[uVar2] != 0x7fff) {
      pbVar3 = borg_kills + i;
      borg_race_death[uVar2] = borg_race_death[uVar2] + 1;
      uVar2 = (ulong)pbVar3->r_idx;
    }
    _Var1 = flag_has_dbg(r_info[uVar2].flags,0xb,1,"r_info[kill->r_idx].flags","RF_UNIQUE");
    if (_Var1) {
      unique_on_level = 0;
    }
  }
  return;
}

Assistant:

void borg_count_death(int i)
{
    borg_kill *kill = &borg_kills[i];

    if (kill->r_idx) {
        /* Hack -- count racial deaths */
        if (borg_race_death[kill->r_idx] < SHRT_MAX)
            borg_race_death[kill->r_idx]++;

        /* if it was a unique then remove the unique_on_level flag */
        if (rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            unique_on_level = 0;
    }
}